

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O2

uint __thiscall llvm::StringMapImpl::LookupBucketFor(StringMapImpl *this,StringRef Name)

{
  StringMapEntryBase **ppSVar1;
  StringMapEntryBase *pSVar2;
  long lVar3;
  bool bVar4;
  uint32_t uVar5;
  StringMapEntryBase **ppSVar6;
  uint32_t in_ECX;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint32_t uVar10;
  uint uVar12;
  ulong uVar13;
  StringRef Buffer;
  StringRef RHS;
  ulong uVar11;
  
  uVar7 = this->NumBuckets;
  if (uVar7 == 0) {
    init(this,(EVP_PKEY_CTX *)0x10);
    uVar7 = this->NumBuckets;
  }
  Buffer.Length = 0;
  Buffer.Data = (char *)Name.Length;
  uVar5 = djbHash((llvm *)Name.Data,Buffer,in_ECX);
  ppSVar1 = this->TheTable;
  lVar3 = (ulong)this->NumBuckets * 8 + 8;
  iVar8 = 1;
  uVar13 = 0xffffffffffffffff;
  ppSVar6 = ppSVar1;
  uVar10 = uVar5;
  do {
    uVar9 = uVar10 & uVar7 - 1;
    uVar11 = (ulong)uVar9;
    pSVar2 = ppSVar6[uVar11];
    uVar12 = (uint)uVar13;
    if (pSVar2 == (StringMapEntryBase *)0x0) {
      if (uVar12 != 0xffffffff) {
        uVar9 = uVar12;
        uVar11 = (long)(int)uVar12;
      }
      *(uint32_t *)((long)ppSVar1 + uVar11 * 4 + lVar3) = uVar5;
      return uVar9;
    }
    if (pSVar2 == (StringMapEntryBase *)0xfffffffffffffff8) {
      uVar13 = uVar13 & 0xffffffff;
      if (uVar12 == 0xffffffff) {
        uVar13 = uVar11;
      }
    }
    else if (*(uint32_t *)((long)ppSVar1 + uVar11 * 4 + lVar3) == uVar5) {
      RHS.Data = (char *)((long)&pSVar2->StrLen + (ulong)this->ItemSize);
      RHS.Length = pSVar2->StrLen;
      bVar4 = llvm::operator==(Name,RHS);
      if (bVar4) {
        return uVar9;
      }
      ppSVar6 = this->TheTable;
    }
    uVar10 = uVar9 + iVar8;
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

unsigned StringMapImpl::LookupBucketFor(StringRef Name) {
  unsigned HTSize = NumBuckets;
  if (HTSize == 0) {  // Hash table unallocated so far?
    init(16);
    HTSize = NumBuckets;
  }
  unsigned FullHashValue = djbHash(Name, 0);
  unsigned BucketNo = FullHashValue & (HTSize-1);
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  unsigned ProbeAmt = 1;
  int FirstTombstone = -1;
  while (true) {
    StringMapEntryBase *BucketItem = TheTable[BucketNo];
    // If we found an empty bucket, this key isn't in the table yet, return it.
    if (LLVM_LIKELY(!BucketItem)) {
      // If we found a tombstone, we want to reuse the tombstone instead of an
      // empty bucket.  This reduces probing.
      if (FirstTombstone != -1) {
        HashTable[FirstTombstone] = FullHashValue;
        return FirstTombstone;
      }

      HashTable[BucketNo] = FullHashValue;
      return BucketNo;
    }

    if (BucketItem == getTombstoneVal()) {
      // Skip over tombstones.  However, remember the first one we see.
      if (FirstTombstone == -1) FirstTombstone = BucketNo;
    } else if (LLVM_LIKELY(HashTable[BucketNo] == FullHashValue)) {
      // If the full hash value matches, check deeply for a match.  The common
      // case here is that we are only looking at the buckets (for item info
      // being non-null and for the full hash value) not at the items.  This
      // is important for cache locality.

      // Do the comparison like this because Name isn't necessarily
      // null-terminated!
      char *ItemStr = (char*)BucketItem+ItemSize;
      if (Name == StringRef(ItemStr, BucketItem->getKeyLength())) {
        // We found a match!
        return BucketNo;
      }
    }

    // Okay, we didn't find the item.  Probe to the next bucket.
    BucketNo = (BucketNo+ProbeAmt) & (HTSize-1);

    // Use quadratic probing, it has fewer clumping artifacts than linear
    // probing and has good cache behavior in the common case.
    ++ProbeAmt;
  }
}